

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_test.cpp
# Opt level: O2

void __thiscall Image_CopyRectOut_Test::TestBody(Image_CopyRectOut_Test *this)

{
  Point2i p;
  pointer pfVar1;
  pointer pbVar2;
  long lVar3;
  Allocator alloc;
  int iVar4;
  float *pfVar5;
  int c;
  pointer pfVar6;
  char *message;
  ColorEncodingHandle *encoding;
  int nc;
  int x;
  ulong uVar7;
  long lVar8;
  bool bVar9;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  Bounds2iIterator BVar10;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  channels;
  span<float> buf_00;
  AssertHelper local_248;
  int local_23c;
  AssertionResult gtest_ar_;
  AssertHelper local_228;
  PixelFormat local_21c;
  Bounds2iIterator pIter;
  vector<float,_std::allocator<float>_> buf;
  AssertionResult gtest_ar;
  Bounds2i extent;
  WrapMode2D local_1a8;
  WrapMode2D local_1a0;
  ColorEncodingHandle local_198;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  channelNames;
  PixelFormat local_174 [3];
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> orig;
  Image image;
  
  local_174[0] = U256;
  local_174[1] = Half;
  lVar3 = 0;
  local_174[2] = 2;
  do {
    if (lVar3 == 0xc) {
      return;
    }
    local_21c = *(PixelFormat *)((long)local_174 + lVar3);
    local_23c = 0;
    nc = 1;
    while( true ) {
      if (nc == 4) break;
      GetFloatPixels(&orig,(Point2i)0xe0000001d,nc);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&image,"A",(allocator<char> *)&gtest_ar);
      __l._M_len = 1;
      __l._M_array = (iterator)&image;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&channelNames,__l,(allocator_type *)&buf);
      std::__cxx11::string::~string((string *)&image);
      iVar4 = local_23c;
      while (pbVar2 = channelNames.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start, bVar9 = iVar4 != 0,
            iVar4 = iVar4 + -1, bVar9) {
        image._0_8_ = &image.channelNames;
        std::__cxx11::string::_M_construct((ulong)&image,'\x01');
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   &channelNames,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&image);
        std::__cxx11::string::~string((string *)&image);
      }
      lVar8 = (long)channelNames.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)channelNames.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
      local_198.
      super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
      .bits = (TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
               )(TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
                 )pbrt::ColorEncodingHandle::Linear.bits;
      alloc.memoryResource = pstd::pmr::new_delete_resource();
      encoding = &local_198;
      channels.n = lVar8 >> 5;
      channels.ptr = pbVar2;
      pbrt::Image::Image(&image,local_21c,(Point2i)0xe0000001d,channels,encoding,alloc);
      pfVar5 = orig.ptr;
      for (lVar8 = 0; lVar8 != 0xe; lVar8 = lVar8 + 1) {
        for (uVar7 = 0; uVar7 != 0x1d; uVar7 = uVar7 + 1) {
          for (iVar4 = 0; nc != iVar4; iVar4 = iVar4 + 1) {
            pbrt::Image::SetChannel(&image,(Point2i)(lVar8 << 0x20 | uVar7),iVar4,*pfVar5);
            pfVar5 = pfVar5 + 1;
          }
        }
      }
      extent.pMin.super_Tuple2<pbrt::Point2,_int>.x = 2;
      extent.pMin.super_Tuple2<pbrt::Point2,_int>.y = 3;
      extent.pMax.super_Tuple2<pbrt::Point2,_int>.x = 5;
      extent.pMax.super_Tuple2<pbrt::Point2,_int>.y = 10;
      std::vector<float,_std::allocator<float>_>::vector
                (&buf,(long)(nc * 0x15),(allocator_type *)&gtest_ar);
      pfVar1 = buf.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
               ._M_finish;
      pfVar6 = buf.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
               ._M_start;
      pbrt::WrapMode2D::WrapMode2D(&local_1a0,Clamp);
      buf_00.n = (long)pfVar1 - (long)pfVar6 >> 2;
      buf_00.ptr = pfVar6;
      pbrt::Image::CopyRectOut(&image,&extent,buf_00,local_1a0);
      pIter.p.super_Tuple2<pbrt::Point2,_int> = extent.pMin.super_Tuple2<pbrt::Point2,_int>;
      pfVar6 = buf.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
               ._M_start;
      pIter.bounds = &extent;
      while( true ) {
        BVar10 = pbrt::end(&extent);
        if (((pIter.p.super_Tuple2<pbrt::Point2,_int>.x ==
              BVar10.p.super_Tuple2<pbrt::Point2,_int>.x) &&
            (pIter.p.super_Tuple2<pbrt::Point2,_int>.y == BVar10.p.super_Tuple2<pbrt::Point2,_int>.y
            )) && (pIter.bounds == BVar10.bounds)) break;
        for (iVar4 = 0; nc != iVar4; iVar4 = iVar4 + 1) {
          gtest_ar_.message_.ptr_ =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          gtest_ar_.success_ =
               pfVar6 != buf.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                         super__Vector_impl_data._M_finish;
          if (pfVar6 == buf.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_finish) {
            testing::Message::Message((Message *)&local_248);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)&gtest_ar,(internal *)&gtest_ar_,
                       (AssertionResult *)"bufIter == buf.end()","true","false",(char *)encoding);
            testing::internal::AssertHelper::AssertHelper
                      (&local_228,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image_test.cpp"
                       ,0xf9,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
            testing::internal::AssertHelper::operator=(&local_228,(Message *)&local_248);
            testing::internal::AssertHelper::~AssertHelper(&local_228);
            std::__cxx11::string::~string((string *)&gtest_ar);
            testing::internal::
            scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)&local_248);
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~scoped_ptr(&gtest_ar_.message_);
            std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
                      (&buf.super__Vector_base<float,_std::allocator<float>_>);
            pbrt::Image::~Image(&image);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector(&channelNames);
            pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::~vector(&orig);
            return;
          }
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~scoped_ptr(&gtest_ar_.message_);
          p = pIter.p;
          pbrt::WrapMode2D::WrapMode2D(&local_1a8,Clamp);
          gtest_ar_._0_4_ = pbrt::Image::GetChannel(&image,p,iVar4,local_1a8);
          testing::internal::CmpHelperEQ<float,float>
                    ((internal *)&gtest_ar,"*bufIter","image.GetChannel(*pIter, c)",pfVar6,
                     (float *)&gtest_ar_);
          if (gtest_ar.success_ == false) {
            testing::Message::Message((Message *)&gtest_ar_);
            message = "";
            if (gtest_ar.message_.ptr_ !=
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              message = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
            }
            testing::internal::AssertHelper::AssertHelper
                      (&local_248,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image_test.cpp"
                       ,0xfa,message);
            testing::internal::AssertHelper::operator=(&local_248,(Message *)&gtest_ar_);
            testing::internal::AssertHelper::~AssertHelper(&local_248);
            testing::internal::
            scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)&gtest_ar_);
          }
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~scoped_ptr(&gtest_ar.message_);
          pfVar6 = pfVar6 + 1;
        }
        pbrt::Bounds2iIterator::operator++(&pIter);
      }
      std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
                (&buf.super__Vector_base<float,_std::allocator<float>_>);
      pbrt::Image::~Image(&image);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&channelNames);
      pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::~vector(&orig);
      local_23c = local_23c + 1;
      nc = nc + 1;
    }
    lVar3 = lVar3 + 4;
  } while( true );
}

Assistant:

TEST(Image, CopyRectOut) {
    Point2i res(29, 14);

    for (auto format : {PixelFormat::U256, PixelFormat::Half, PixelFormat::Float}) {
        // for (int nc : { 1, 3 }) {
        for (int nc = 1; nc < 4; ++nc) {
            pstd::vector<float> orig = GetFloatPixels(res, nc);

            std::vector<std::string> channelNames = {"A"};
            for (int i = 1; i < nc; ++i)
                channelNames.push_back(std::string(1, 'A' + 1));

            Image image(format, res, channelNames, ColorEncodingHandle::Linear);

            auto origIter = orig.begin();
            for (int y = 0; y < res[1]; ++y)
                for (int x = 0; x < res[0]; ++x)
                    for (int c = 0; c < nc; ++c, ++origIter)
                        image.SetChannel({x, y}, c, *origIter);

            Bounds2i extent(Point2i(2, 3), Point2i(5, 10));
            std::vector<float> buf(extent.Area() * nc);

            image.CopyRectOut(extent, pstd::MakeSpan(buf));

            // Iterate through the points in the extent and the buffer
            // together.
            auto bufIter = buf.begin();
            for (auto pIter = begin(extent); pIter != end(extent); ++pIter) {
                for (int c = 0; c < nc; ++c) {
                    ASSERT_FALSE(bufIter == buf.end());
                    EXPECT_EQ(*bufIter, image.GetChannel(*pIter, c));
                    ++bufIter;
                }
            }
        }
    }
}